

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

void compact_suite::run(void)

{
  test_int8_empty();
  test_int8();
  test_int16();
  test_int32();
  test_int64();
  test_float32();
  test_float64();
  return;
}

Assistant:

void run()
{
    test_int8_empty();
    test_int8();
    test_int16();
    test_int32();
    test_int64();
    test_float32();
    test_float64();
}